

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

bool __thiscall
Js::ScriptContext::IsInEvalMap
          (ScriptContext *this,FastEvalMapString *key,BOOL isIndirect,ScriptFunction **ppFuncScript)

{
  uint uVar1;
  TwoLevelHashDictionary<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>,_JsUtil::Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>,_Js::EvalMapStringInternal<false>_>
  *this_00;
  bool bVar2;
  char16_t *form;
  
  this_00 = (&(((this->super_ScriptContextBase).javascriptLibrary)->cache).evalCacheDictionary)
            [isIndirect != 0].ptr;
  if (this_00 !=
      (TwoLevelHashDictionary<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>,_JsUtil::Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>,_Js::EvalMapStringInternal<false>_>
       *)0x0) {
    if (DAT_0144d962 == '\x01') {
      uVar1 = (key->str).len;
      bVar2 = TwoLevelHashDictionary<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>,_JsUtil::Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>,_Js::EvalMapStringInternal<false>_>
              ::TryGetValue(this_00,key,ppFuncScript);
      form = L"EvalMap cache miss:\t source size = %d\n";
      if (bVar2) {
        form = L"EvalMap cache hit:\t source size = %d\n";
      }
      Output::Print(form,(ulong)uVar1);
    }
    bVar2 = TwoLevelHashDictionary<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>,_JsUtil::Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>,_Js::EvalMapStringInternal<false>_>
            ::TryGetValue(this_00,key,ppFuncScript);
    if (bVar2) {
      TwoLevelHashDictionary<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>,_JsUtil::Cache<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<true>,_15,_Memory::Recycler>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry>,_Js::EvalMapStringInternal<false>_>
      ::NotifyAdd(this_00,key);
      return true;
    }
  }
  return false;
}

Assistant:

bool ScriptContext::IsInEvalMap(FastEvalMapString const& key, BOOL isIndirect, ScriptFunction **ppFuncScript)
    {
        EvalCacheDictionary *dict = isIndirect ? this->Cache()->indirectEvalCacheDictionary : this->Cache()->evalCacheDictionary;
        if (dict == nullptr)
        {
            return false;
        }
#ifdef PROFILE_EVALMAP
        if (Configuration::Global.flags.ProfileEvalMap)
        {
            charcount_t len = key.str.GetLength();
            if (dict->TryGetValue(key, ppFuncScript))
            {
                Output::Print(_u("EvalMap cache hit:\t source size = %d\n"), len);
            }
            else
            {
                Output::Print(_u("EvalMap cache miss:\t source size = %d\n"), len);
            }
        }
#endif

        // If eval map cleanup is false, to preserve existing behavior, add it to the eval map MRU list
        bool success = dict->TryGetValue(key, ppFuncScript);

        if (success)
        {
            dict->NotifyAdd(key);
#ifdef VERBOSE_EVAL_MAP
#if DBG
            dict->DumpKeepAlives();
#endif
#endif
        }

        return success;
    }